

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimMST.h
# Opt level: O2

double __thiscall PrimMST<BinaryHeap,_false>::operator()(PrimMST<BinaryHeap,_false> *this)

{
  pointer pPVar1;
  __uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true> __s;
  __uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true> __s_00;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong __n;
  double dVar7;
  double dVar8;
  unique_ptr<bool[],_std::default_delete<bool[]>_> vis;
  double local_78;
  unique_ptr<double[],_std::default_delete<double[]>_> dis;
  Heap heap;
  value_type local_40;
  
  uVar2 = (long)(this->pts).super__Vector_base<Point2d,_std::allocator<Point2d>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->pts).super__Vector_base<Point2d,_std::allocator<Point2d>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = uVar2 >> 4;
  heap.c.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  heap.c.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  heap.c.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (int)uVar6;
  __n = (ulong)iVar5;
  __s.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>)operator_new__(__n);
  memset((void *)__s.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,__n);
  uVar2 = -(ulong)(__n >> 0x3d != 0) | (long)(uVar2 * 0x10000000) >> 0x1d;
  vis._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)
                 (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)
                 __s.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  __s_00.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)operator_new__(uVar2);
  memset((void *)__s_00.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,0,uVar2);
  for (lVar3 = 0; __n * 8 != lVar3; lVar3 = lVar3 + 8) {
    *(undefined8 *)
     ((long)__s_00.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3) = 0x7fefffffffffffff;
  }
  *(undefined8 *)
   __s_00.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0;
  local_40.first = 0.0;
  local_40.second = 0;
  dis._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       __s_00.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  std::
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
  ::push(&heap,&local_40);
  uVar6 = uVar6 & 0xffffffff;
  if (iVar5 < 1) {
    uVar6 = 0;
  }
  local_78 = 0.0;
  do {
    lVar3 = 8;
    do {
      if (heap.c.
          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          heap.c.
          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&dis);
        std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr(&vis);
        std::_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
        ~_Vector_base((_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       *)&heap);
        return local_78;
      }
      dVar7 = (heap.c.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->first;
      lVar4 = (long)(heap.c.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second;
      std::
      priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
      ::pop(&heap);
    } while (*(char *)((long)vis._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t
                             .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                             super__Head_base<0UL,_bool_*,_false>._M_head_impl + lVar4) != '\0');
    *(undefined1 *)
     ((long)vis._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
            super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
            super__Head_base<0UL,_bool_*,_false>._M_head_impl + lVar4) = 1;
    local_78 = local_78 + dVar7;
    for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      if (*(char *)((long)vis._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                          super__Head_base<0UL,_bool_*,_false>._M_head_impl + uVar2) == '\0') {
        pPVar1 = (this->pts).super__Vector_base<Point2d,_std::allocator<Point2d>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar7 = pPVar1[lVar4].x - *(double *)((long)pPVar1 + lVar3 + -8);
        dVar8 = pPVar1[lVar4].y - *(double *)((long)&pPVar1->x + lVar3);
        dVar7 = SQRT(dVar7 * dVar7 + dVar8 * dVar8);
        if (dVar7 < *(double *)
                     ((long)dis._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                            _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                            super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar2 * 8)) {
          *(double *)
           ((long)dis._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar2 * 8) = dVar7;
          local_40.second = (int)uVar2;
          local_40.first = dVar7;
          std::
          priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
          ::push(&heap,&local_40);
        }
      }
      lVar3 = lVar3 + 0x10;
    }
  } while( true );
}

Assistant:

double operator()()
	{
		const int n = static_cast<int>(pts.size());
		Heap heap;
		std::unique_ptr<bool[]> vis(new bool[n]{});
		std::unique_ptr<double[]> dis(new double[n]{});
		std::fill(dis.get(), dis.get() + n, std::numeric_limits<double>::max());
		double ans = 0;
		dis[0] = 0.0, heap.push({0.0, 0});
		while (!heap.empty())
		{
			auto[cur, id] = heap.top();
			heap.pop();
			double chkMin;
			if (vis[id])
				continue;
			vis[id] = true;
			ans += cur;
			for (int i = 0; i < n; ++i)
				if (!vis[i] && (chkMin = (pts[id] - pts[i]).length()) < dis[i])
				{
					dis[i] = chkMin;
					heap.push({dis[i], i});
				}
		}
		return ans;
	}